

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

ssize_t __thiscall kj::TestRunner::write(TestRunner *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  StringPtr *params_1;
  String *__return_storage_ptr__;
  StringPtr local_c8;
  undefined1 local_b2 [2];
  undefined1 local_b0 [8];
  String text;
  StringPtr local_88;
  StringPtr local_78;
  StringPtr local_68;
  undefined1 local_58 [8];
  StringPtr endColor;
  StringPtr startColor;
  Color color_local;
  TestRunner *this_local;
  StringPtr message_local;
  StringPtr prefix_local;
  
  message_local.content.size_ = (size_t)__buf;
  StringPtr::StringPtr((StringPtr *)&endColor.content.size_);
  StringPtr::StringPtr((StringPtr *)local_58);
  if ((this->useColor & 1U) != 0) {
    if (__fd == 0) {
      StringPtr::StringPtr(&local_68,"\x1b[0;1;31m");
      endColor.content.size_ = (size_t)local_68.content.ptr;
    }
    else if (__fd == 1) {
      StringPtr::StringPtr(&local_78,"\x1b[0;1;32m");
      endColor.content.size_ = (size_t)local_78.content.ptr;
    }
    else if (__fd == 2) {
      StringPtr::StringPtr(&local_88,"\x1b[0;1;34m");
      endColor.content.size_ = (size_t)local_88.content.ptr;
    }
    StringPtr::StringPtr((StringPtr *)&text.content.disposer,"\x1b[0m");
    local_58 = (undefined1  [8])text.content.disposer;
  }
  local_b2[1] = 0x20;
  local_b2[0] = 10;
  __return_storage_ptr__ = (String *)local_b0;
  params_1 = (StringPtr *)local_58;
  str<kj::StringPtr&,kj::StringPtr&,kj::StringPtr&,char,kj::StringPtr&,char>
            (__return_storage_ptr__,(kj *)&endColor.content.size_,
             (StringPtr *)&message_local.content.size_,params_1,(StringPtr *)(local_b2 + 1),
             (char *)&this_local,(StringPtr *)local_b2,(char *)__return_storage_ptr__);
  StringPtr::StringPtr(&local_c8,__return_storage_ptr__);
  write(this,(int)local_c8.content.ptr,(void *)local_c8.content.size_,(size_t)params_1);
  String::~String((String *)local_b0);
  return extraout_RAX;
}

Assistant:

void write(Color color, StringPtr prefix, StringPtr message) {
    StringPtr startColor, endColor;
    if (useColor) {
      switch (color) {
        case RED:   startColor = "\033[0;1;31m"; break;
        case GREEN: startColor = "\033[0;1;32m"; break;
        case BLUE:  startColor = "\033[0;1;34m"; break;
      }
      endColor = "\033[0m";
    }

    String text = kj::str(startColor, prefix, endColor, ' ', message, '\n');
    write(text);
  }